

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O0

void arrow_line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  ostream *poVar8;
  char *pcVar9;
  uint uVar10;
  int local_6c;
  int local_68;
  int wh_adjustment;
  int rb_adjustment;
  int lt_adjustment;
  Am_Style ls;
  int head_width;
  int head_length;
  int width;
  int left;
  int x2;
  int x1;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object self;
  Am_Slot slot;
  bool leftwidth_changed;
  bool x1x2_changed;
  Am_Web_Events *events_local;
  
  bVar1 = false;
  bVar2 = false;
  Am_Web_Events::Start(events);
  self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_30);
  Am_Object::Am_Object(&local_28,&local_30);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_30);
  pAVar7 = Am_Object::Get(&local_28,0x8b,0);
  left = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,0x8d,0);
  width = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,100,0);
  head_length = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,0x66,0);
  head_width = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,0x90,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,0x91,0);
  ls.data._4_4_ = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_28,0x6b,0);
  Am_Style::Am_Style((Am_Style *)&rb_adjustment,pAVar7);
  get_thickness_adjustments((Am_Style *)&rb_adjustment,&wh_adjustment,&local_68,&local_6c);
  iVar6 = ls.data._4_4_;
  if (ls.data._4_4_ < iVar5) {
    iVar6 = iVar5;
  }
  wh_adjustment = iVar6 + wh_adjustment;
  local_68 = iVar6 + local_68;
  local_6c = iVar6 * 2 + local_6c;
  do {
    bVar3 = Am_Web_Events::Last(events);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      if (bVar1) {
        Am_Object::Set(&local_28,0x8b,left,0);
        Am_Object::Set(&local_28,0x8d,width,0);
      }
      if (bVar2) {
        Am_Object::Set(&local_28,100,head_length,0);
        Am_Object::Set(&local_28,0x66,head_width,0);
      }
      Am_Style::~Am_Style((Am_Style *)&rb_adjustment);
      Am_Object::~Am_Object(&local_28);
      return;
    }
    self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key((Am_Slot *)&self);
    uVar10 = (uint)AVar4;
    if ((AVar4 == 100) || (uVar10 == 0x66)) {
      if (left < width) {
        left = head_length + wh_adjustment;
        width = (head_length + head_width) - local_68;
      }
      else {
        left = (head_length + head_width) - local_68;
        width = head_length + wh_adjustment;
      }
      bVar1 = true;
    }
    else if (uVar10 != 0x6b) {
      if ((uVar10 == 0x8b) || (uVar10 == 0x8d)) {
        iVar6 = imin(left,width);
        head_length = iVar6 - wh_adjustment;
        iVar6 = iabs(width - left);
        head_width = iVar6 + local_6c;
        bVar2 = true;
      }
      else if (1 < uVar10 - 0x90) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar8 = std::operator<<(poVar8,"** Bug: unexpected slot in arrow_line_x_validate: ");
        AVar4 = Am_Slot::Get_Key((Am_Slot *)&self);
        pcVar9 = Am_Get_Slot_Name(AVar4);
        poVar8 = std::operator<<(poVar8,pcVar9);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

static void
arrow_line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int head_width = self.Get(Am_HEAD_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  if (head_length > head_width) {
    lt_adjustment += head_length;
    rb_adjustment += head_length;
    wh_adjustment += 2 * head_length;
  } else {
    lt_adjustment += head_width;
    rb_adjustment += head_width;
    wh_adjustment += 2 * head_width;
  }
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
    case Am_HEAD_WIDTH:
    case Am_HEAD_LENGTH:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in arrow_line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}